

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O0

void JSONWorker::NewNode(internalJSONNode *parent,json_string *name,json_string *value,bool array)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  bool condition;
  char *local_130;
  allocator local_121;
  json_string local_120;
  allocator local_f9;
  json_string local_f8;
  internalJSONNode *local_d8;
  internalJSONNode *myinternal;
  string local_c8 [55];
  allocator local_91;
  json_string local_90;
  char *local_70;
  char *start;
  size_t count;
  char *end;
  char *runner;
  json_string _comment;
  JSONNode *child;
  bool array_local;
  json_string *value_local;
  json_string *name_local;
  internalJSONNode *parent_local;
  
  std::__cxx11::string::string((string *)&runner);
  if (array) {
    local_130 = (char *)std::__cxx11::string::data();
  }
  else {
    local_130 = (char *)std::__cxx11::string::data();
  }
  end = local_130;
  lVar1 = std::__cxx11::string::length();
  count = (size_t)(local_130 + lVar1);
  if (*end == '#') {
    while( true ) {
      start = (char *)0x0;
      local_70 = end + 1;
      while (pcVar4 = start, pcVar2 = local_70, pcVar3 = end + 1, end[1] != '#') {
        condition = pcVar3 != (char *)count;
        end = pcVar3;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_90,"Removing white space failed",&local_91);
        JSONDebug::_JSON_ASSERT(condition,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
        start = start + 1;
      }
      end = pcVar3;
      if (start != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_c8,pcVar2,(ulong)pcVar4,(allocator *)((long)&myinternal + 7));
        std::__cxx11::string::operator+=((string *)&runner,local_c8);
        std::__cxx11::string::~string(local_c8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&myinternal + 7));
      }
      pcVar4 = end + 1;
      pcVar2 = end + 1;
      end = pcVar4;
      if (*pcVar2 != '#') break;
      std::__cxx11::string::operator+=((string *)&runner,'\n');
    }
  }
  pcVar2 = end;
  if (array) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,pcVar2,&local_f9);
    local_d8 = internalJSONNode::newInternal(name,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  }
  else {
    pcVar2 = end + 1;
    end = pcVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,pcVar2,&local_121);
    local_d8 = internalJSONNode::newInternal(&local_120,value);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
  }
  _comment.field_2._8_8_ = ::JSONNode::newJSONNode(local_d8);
  ::JSONNode::set_comment((JSONNode *)_comment.field_2._8_8_,(json_string *)&runner);
  jsonChildren::push_back(parent->Children,(JSONNode *)_comment.field_2._8_8_);
  std::__cxx11::string::~string((string *)&runner);
  return;
}

Assistant:

inline void JSONWorker::NewNode(const internalJSONNode * parent, const json_string & name, const json_string & value, ARRAY_PARAM) json_nothrow {
    #ifdef JSON_COMMENTS
	   JSONNode * child;
	   START_MEM_SCOPE
		  json_string _comment;
		  START_MEM_SCOPE
			 const json_char * runner = ((array) ? value.data() : name.data());
			 #ifdef JSON_DEBUG
				const json_char * const end = runner + value.length();
			#endif
			 if (json_unlikely(*runner == JSON_TEMP_COMMENT_IDENTIFIER)){  //multiple comments will be consolidated into one
				size_t count;
				const json_char * start;
			    newcomment:
				count = 0;
				start = runner + 1;
				while(*(++runner) != JSON_TEMP_COMMENT_IDENTIFIER){
				    JSON_ASSERT(runner != end, JSON_TEXT("Removing white space failed"));
					++count;
				}
				if (count) _comment += json_string(start, count);
				if (json_unlikely(*(++runner) == JSON_TEMP_COMMENT_IDENTIFIER)){ //step past the trailing tag
				    _comment += JSON_TEXT('\n');
				    goto newcomment;
				}
			 }
			 internalJSONNode * myinternal;
			 if (array){
				myinternal = internalJSONNode::newInternal(name, runner);
			 } else {
				myinternal = internalJSONNode::newInternal(++runner, value);
			 }
			 child = JSONNode::newJSONNode(myinternal);
		  END_MEM_SCOPE
		  child -> set_comment(_comment);
	   END_MEM_SCOPE
	   const_cast<internalJSONNode*>(parent) -> CHILDREN -> push_back(child);   //attach it to the parent node
    #else
	if (name.empty()){
	   	const_cast<internalJSONNode*>(parent) -> CHILDREN -> push_back(JSONNode::newJSONNode(internalJSONNode::newInternal(name, value)));	    //attach it to the parent node
	} else {
		const_cast<internalJSONNode*>(parent) -> CHILDREN -> push_back(JSONNode::newJSONNode(internalJSONNode::newInternal(json_string(name.begin() + 1, name.end()), value)));	    //attach it to the parent node
	}
    #endif
}